

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O3

Ast __thiscall
lambda::eval(lambda::Ast_const&)::helper::substitute(lambda::Ast_const&,lambda::Ast_const__int_
          (void *this,Ast *expr,Ast *arg,int index)

{
  long lVar1;
  undefined8 *puVar2;
  Ast AVar3;
  int local_34;
  _Variadic_union<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>
  local_30;
  Ast *local_8;
  
  local_30._8_8_ = &local_34;
  lVar1 = (long)(char)*(__index_type *)
                       ((long)&(((expr->underlying_).
                                 super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->
                               super__Variant_base<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>
                               ).
                               super__Move_assign_alias<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>
                               .
                               super__Copy_assign_alias<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>
                               .
                               super__Move_ctor_alias<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>
                       + 0x28);
  local_34 = index;
  local_30._0_8_ = arg;
  local_30._16_8_ = arg;
  local_30._24_8_ = local_30._8_8_;
  local_30._32_8_ = local_30._8_8_;
  local_8 = arg;
  if (lVar1 != -1) {
    AVar3 = (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__deduce_visit_result<lambda::Ast>,_ublib::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/strega-nil[P]lambda/source/lambda/ast.cpp:72:11),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/strega-nil[P]lambda/source/lambda/ast.cpp:76:11),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/strega-nil[P]lambda/source/lambda/ast.cpp:81:11),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/strega-nil[P]lambda/source/lambda/ast.cpp:88:11)>_&&,_const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>_&>
              ::_S_vtable._M_arr[lVar1]._M_data)
                      ((Overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:72:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:76:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:81:11),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_strega_nil[P]lambda_source_lambda_ast_cpp:88:11)>
                        *)this,(variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>
                                *)&local_30._M_first);
    return (Ast)AVar3.underlying_.
                super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = &PTR__exception_00109b68;
  puVar2[1] = "std::visit: variant is valueless";
  __cxa_throw(puVar2,&std::bad_variant_access::typeinfo,std::exception::~exception);
}

Assistant:

static Ast substitute(Ast const& expr, Ast const& arg, int index) {
      return ublib::match(expr)(
          [&](Ast::Lambda const& e) {
            return Ast(Ast::Lambda(
                e.variable(), substitute(e.expression(), arg, index + 1)));
          },
          [&](Ast::Call const& e) {
            return Ast(Ast::Call(
                substitute(e.callee(), arg, index),
                substitute(e.argument(), arg, index)));
          },
          [&](Ast::Variable const& e) {
            if (e.index() == index) {
              return arg;
            } else {
              return Ast(e);
            }
          },
          [&](Ast::Free_variable const& e) { return Ast(e); });
    }